

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall Shell::Options::set(Options *this,char *name,char *value,bool longOpt)

{
  bool bVar1;
  bool bVar2;
  IgnoreMissing IVar3;
  undefined8 uVar4;
  ostream *poVar5;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  Options *in_RDI;
  string first;
  Iterator sit;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sim;
  string msg;
  ValueNotFoundException *anon_var_0;
  string *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  AbstractOptionValue *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  string *in_stack_fffffffffffffc98;
  LookupWrapper *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  LookupWrapper *in_stack_fffffffffffffcb0;
  byte local_2eb;
  byte local_2ea;
  allocator<char> local_c9;
  string local_c8 [37];
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  string local_78 [35];
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  char *local_18;
  char *local_10;
  
  local_19 = in_CL & 1;
  local_42 = 0;
  local_55 = 0;
  local_7a = 0;
  local_7b = 0;
  local_a2 = 0;
  local_a3 = 0;
  bVar2 = false;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_19 != 0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               (char *)in_stack_fffffffffffffc78,(allocator<char> *)in_stack_fffffffffffffc70);
    local_55 = 1;
    LookupWrapper::findLong(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               (char *)in_stack_fffffffffffffc78,(allocator<char> *)in_stack_fffffffffffffc70);
    local_7b = 1;
    bVar1 = AbstractOptionValue::set
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                       (bool)in_stack_fffffffffffffc47);
    local_2ea = 1;
    if (!bVar1) goto LAB_00c33f96;
  }
  bVar2 = (local_19 & 1) == 0;
  local_2eb = 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               (char *)in_stack_fffffffffffffc78,(allocator<char> *)in_stack_fffffffffffffc70);
    local_a3 = 1;
    LookupWrapper::findShort(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               (char *)in_stack_fffffffffffffc78,(allocator<char> *)in_stack_fffffffffffffc70);
    bVar1 = AbstractOptionValue::set
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                       (bool)in_stack_fffffffffffffc47);
    local_2eb = bVar1 ^ 0xff;
  }
  local_2ea = local_2eb;
LAB_00c33f96:
  if (bVar2) {
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string(local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  if (((local_2ea & 1) != 0) && (IVar3 = ignoreMissing(in_RDI), IVar3 != ON)) {
    if (IVar3 == OFF) {
      uVar4 = __cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (char *)in_stack_fffffffffffffc78,(allocator<char> *)in_stack_fffffffffffffc70);
      std::operator+(in_stack_fffffffffffffc48,
                     (char *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (char *)in_stack_fffffffffffffc78,(allocator<char> *)in_stack_fffffffffffffc70);
      std::operator+(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      std::operator+(in_stack_fffffffffffffc48,
                     (char *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
      Lib::UserErrorException::Exception
                ((UserErrorException *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40)
                 ,in_stack_fffffffffffffc38);
      __cxa_throw(uVar4,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    if ((IVar3 == WARN) && (bVar2 = outputAllowed(false), bVar2)) {
      addCommentSignForSZS((ostream *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40))
      ;
      poVar5 = std::operator<<((ostream *)&std::cout,"% WARNING: invalid value ");
      poVar5 = std::operator<<(poVar5,local_18);
      poVar5 = std::operator<<(poVar5," for option ");
      poVar5 = std::operator<<(poVar5,local_10);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Options::set(const char* name,const char* value, bool longOpt)
{
  try {
    if((longOpt && !_lookup.findLong(name)->set(value)) ||
        (!longOpt && !_lookup.findShort(name)->set(value))) {
      switch (ignoreMissing()) {
      case IgnoreMissing::OFF:
        USER_ERROR((std::string) value +" is an invalid value for "+(std::string)name+"\nSee help or use explain i.e. vampire -explain mode");
        break;
      case IgnoreMissing::WARN:
        if (outputAllowed()) {
          addCommentSignForSZS(std::cout);
          std::cout << "% WARNING: invalid value "<< value << " for option " << name << endl;
        }
        break;
      case IgnoreMissing::ON:
        break;
      }
    }
  }
  catch (const ValueNotFoundException&) {
    if (_ignoreMissing.actualValue != IgnoreMissing::ON) {
      std::string msg = (std::string)name + (longOpt ? " is not a valid option" : " is not a valid short option (did you mean --?)");
      if (_ignoreMissing.actualValue == IgnoreMissing::WARN) {
        if (outputAllowed()) {
          addCommentSignForSZS(std::cout);
          std::cout << "% WARNING: " << msg << endl;
        }
        return;
      } // else:
      Stack<std::string> sim = getSimilarOptionNames(name,false);
      Stack<std::string>::Iterator sit(sim);
      if(sit.hasNext()){
        std::string first = sit.next();
        msg += "\n\tMaybe you meant ";
        if(sit.hasNext()) msg += "one of:\n\t\t";
        msg += first;
        while(sit.hasNext()){ msg+="\n\t\t"+sit.next();}
        msg+="\n\tYou can use -explain <option> to explain an option";
      }
      USER_ERROR(msg);
    }
  }
}